

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivial.h
# Opt level: O0

void __thiscall
trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::trivial_output_t(trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                   *this,flagser_parameters *params)

{
  undefined2 *in_RSI;
  output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *in_RDI;
  
  output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>::
  output_t(in_RDI);
  in_RDI->_vptr_output_t = (_func_int **)&PTR__trivial_output_t_00200970;
  *(undefined2 *)&in_RDI[2]._vptr_output_t = 0;
  *(undefined2 *)((long)&in_RDI[2]._vptr_output_t + 2) = in_RSI[1];
  *(undefined2 *)((long)&in_RDI[2]._vptr_output_t + 4) = *in_RSI;
  *(undefined2 *)((long)&in_RDI[2]._vptr_output_t + 6) = in_RSI[2];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b7e83);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b7e90);
  *(undefined4 *)&in_RDI[9]._vptr_output_t = 0;
  *(byte *)((long)&in_RDI[9]._vptr_output_t + 4) = *(byte *)(in_RSI + 7) & 1;
  *(byte *)((long)&in_RDI[9]._vptr_output_t + 5) = (*(byte *)(in_RSI + 6) ^ 0xff) & 1;
  return;
}

Assistant:

trivial_output_t(const flagser_parameters& params)
	    : min_dimension(params.min_dimension), max_dimension(params.max_dimension), modulus(params.modulus),
	      approximate_computation(params.approximate_computation),
	      aggregate_results(!params.split_into_connected_components) {}